

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  size_t sVar3;
  tuple<wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_> tVar4;
  __uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_50;
  string_view local_48;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar3 = strlen(__s);
  tVar4.
  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
       operator_new(0x78);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(char **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                   .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x18) =
       __s;
  *(size_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x20) = sVar3;
  *(Offset *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x38) = 7;
  *(undefined ***)
   tVar4.
   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
   super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       &PTR__MemoryModuleField_002006e8;
  local_48.data_ = (char *)0x0;
  local_48.size_ = 0;
  string_view::to_string_abi_cxx11_
            ((string *)
             ((long)tVar4.
                    super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                    .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x40),
             &local_48);
  *(undefined2 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x70) =
       *(undefined2 *)&page_limits->has_max;
  uVar2 = page_limits->max;
  *(uint64_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x60) =
       page_limits->initial;
  *(uint64_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x68) = uVar2;
  local_50._M_t.
  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       (tuple<wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
       (tuple<wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
       tVar4.
       super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
       .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)&local_50);
  if ((_Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
      .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl !=
      (MemoryModuleField *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = MakeUnique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}